

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

void __thiscall QByteArray::reallocGrowData(QByteArray *this,qsizetype n)

{
  Data *pDVar1;
  size_t __n;
  long n_00;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = n + (ulong)(n == 0);
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char>::allocateGrow(&local_38,&this->d,n_00,GrowsAtEnd);
    if (local_38.ptr == (char *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        qBadAlloc();
      }
    }
    else {
      __n = (this->d).size;
      if (__n != 0) {
        memcpy(local_38.ptr + local_38.size,(this->d).ptr,__n);
        local_38.size = local_38.size + __n;
      }
      local_38.ptr[local_38.size] = '\0';
      QArrayDataPointer<char>::operator=(&this->d,&local_38);
      if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d)->super_QArrayData,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
    }
  }
  else {
    if (pDVar1 == (Data *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = (pDVar1->super_QArrayData).alloc;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtPrivate::QPodArrayOps<char>::reallocate((QPodArrayOps<char> *)this,lVar2 + n_00,Grow);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QByteArray::reallocGrowData(qsizetype n)
{
    if (!n)  // expected to always allocate
        n = 1;

    if (d->needsDetach()) {
        DataPointer dd(DataPointer::allocateGrow(d, n, QArrayData::GrowsAtEnd));
        Q_CHECK_PTR(dd.data());
        dd->copyAppend(d.data(), d.data() + d.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(d.constAllocatedCapacity() + n, QArrayData::Grow);
    }
}